

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::Impl::lookup(Impl *this,uint64_t parent,StringPtr childName)

{
  iterator iVar1;
  size_t in_R8;
  Maybe<unsigned_long> MVar2;
  StringPtr name;
  uint64_t parent_local;
  Fault f;
  anon_union_104_1_a8c68091_for_NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>_2
  local_88;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  
  parent_local = (uint64_t)childName.content.ptr;
  f.exception = (Exception *)parent_local;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(parent + 0x1b0),(key_type *)&f);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (*(Node **)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                       ._M_cur + 0x10) != (Node *)0x0)) {
    name.content.size_ = in_R8;
    name.content.ptr = (char *)childName.content.size_;
    Node::resolveMember((Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                         *)&f,*(Node **)((long)iVar1.
                                               super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                               ._M_cur + 0x10),name);
    if (((char)f.exception == '\x01') && (local_88.value.tag == 1)) {
      *(undefined1 *)&(this->super_LazyLoadCallback)._vptr_LazyLoadCallback = 1;
      *(undefined8 *)&this->annotationFlag = local_88._8_8_;
    }
    else {
      *(undefined1 *)&(this->super_LazyLoadCallback)._vptr_LazyLoadCallback = 0;
    }
    MVar2.ptr.field_1.value = extraout_RDX.value;
    MVar2.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar2.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],unsigned_long&>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x4e0,FAILED,(char *)0x0,
             "\"lookup()s parameter \'parent\' must be a known ID.\", parent",
             (char (*) [49])"lookup()s parameter \'parent\' must be a known ID.",&parent_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Maybe<uint64_t> Compiler::Impl::lookup(uint64_t parent, kj::StringPtr childName) {
  // Looking up members does not use the workspace, so we don't need to lock it.
  KJ_IF_MAYBE(parentNode, findNode(parent)) {
    KJ_IF_MAYBE(child, parentNode->resolveMember(childName)) {
      if (child->is<NodeTranslator::Resolver::ResolvedDecl>()) {
        return child->get<NodeTranslator::Resolver::ResolvedDecl>().id;
      } else {
        // An alias. We don't support looking up aliases with this method.
        return nullptr;
      }
    } else {
      return nullptr;
    }
  } else {
    KJ_FAIL_REQUIRE("lookup()s parameter 'parent' must be a known ID.", parent);
  }
}